

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

void __thiscall duckdb_re2::Regexp::AddRuneToString(Regexp *this,Rune r)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  void *pvVar5;
  uint uVar6;
  
  uVar1 = (this->arguments).repeat.max_;
  if ((ulong)uVar1 == 0) {
    pvVar5 = operator_new__(0x20);
    (this->arguments).the_union_[1] = pvVar5;
  }
  else if ((7 < (int)uVar1) &&
          (uVar6 = uVar1 - (uVar1 >> 1 & 0x55555555),
          uVar6 = (uVar6 >> 2 & 0x33333333) + (uVar6 & 0x33333333),
          ((uVar6 >> 4) + uVar6 & 0xf0f0f0f) * 0x1010101 >> 0x18 < 2)) {
    pvVar5 = (this->arguments).the_union_[1];
    pvVar3 = operator_new__((ulong)uVar1 << 3);
    (this->arguments).the_union_[1] = pvVar3;
    if (0 < (this->arguments).repeat.max_) {
      lVar4 = 0;
      do {
        *(undefined4 *)((long)&(((this->arguments).capture.name_)->_M_dataplus)._M_p + lVar4 * 4) =
             *(undefined4 *)((long)pvVar5 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 < (this->arguments).repeat.max_);
    }
    if (pvVar5 != (void *)0x0) {
      operator_delete__(pvVar5);
    }
  }
  iVar2 = (this->arguments).repeat.max_;
  (this->arguments).repeat.max_ = iVar2 + 1;
  *(Rune *)((long)&(((this->arguments).capture.name_)->_M_dataplus)._M_p + (long)iVar2 * 4) = r;
  return;
}

Assistant:

void Regexp::AddRuneToString(Rune r) {
  DCHECK(op_ == kRegexpLiteralString);
  if (arguments.literal_string.nrunes_ == 0) {
    // start with 8
	arguments.literal_string.runes_ = new Rune[8];
  } else if (arguments.literal_string.nrunes_ >= 8 && (arguments.literal_string.nrunes_ & (arguments.literal_string.nrunes_ - 1)) == 0) {
    // double on powers of two
    Rune *old = arguments.literal_string.runes_;
	arguments.literal_string.runes_ = new Rune[arguments.literal_string.nrunes_ * 2];
    for (int i = 0; i < arguments.literal_string.nrunes_; i++)
		arguments.literal_string.runes_[i] = old[i];
    delete[] old;
  }

  arguments.literal_string.runes_[arguments.literal_string.nrunes_++] = r;
}